

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O0

int __thiscall
Assimp::FindInvalidDataProcess::ProcessMesh(FindInvalidDataProcess *this,aiMesh *pMesh)

{
  uint uVar1;
  bool bVar2;
  Logger *this_00;
  reference rVar3;
  reference local_c0;
  reference local_b0;
  aiFace *local_a0;
  aiFace *f_1;
  uint m_1;
  uint a;
  uint i_1;
  _Bit_type local_80;
  uint local_74;
  aiFace *paStack_70;
  uint i;
  aiFace *f;
  uint m;
  allocator<bool> local_52;
  bool local_51;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> dirtyMask;
  bool ret;
  aiMesh *pMesh_local;
  FindInvalidDataProcess *this_local;
  
  dirtyMask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  uVar1 = pMesh->mNumVertices;
  local_51 = pMesh->mNumFaces != 0;
  std::allocator<bool>::allocator(&local_52);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)uVar1,&local_51,&local_52);
  std::allocator<bool>::~allocator(&local_52);
  for (f._0_4_ = 0; (uint)f < pMesh->mNumFaces; f._0_4_ = (uint)f + 1) {
    paStack_70 = pMesh->mFaces + (uint)f;
    for (local_74 = 0; local_74 < paStack_70->mNumIndices; local_74 = local_74 + 1) {
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_50,
                         (ulong)paStack_70->mIndices[local_74]);
      _i_1 = rVar3;
      std::_Bit_reference::operator=((_Bit_reference *)&i_1,false);
    }
  }
  if (pMesh->mVertices != (aiVector3D *)0x0) {
    bVar2 = ProcessArray<aiVector3t<float>>
                      (&pMesh->mVertices,pMesh->mNumVertices,"positions",
                       (vector<bool,_std::allocator<bool>_> *)local_50,false,true);
    if (bVar2) {
      this_00 = DefaultLogger::get();
      Logger::error(this_00,"Deleting mesh: Unable to continue without vertex positions");
      this_local._4_4_ = 2;
      goto LAB_0054c457;
    }
  }
  if ((this->mIgnoreTexCoods & 1U) == 0) {
    m_1 = 0;
    while( true ) {
      bVar2 = false;
      if (m_1 < 8) {
        bVar2 = pMesh->mTextureCoords[m_1] != (aiVector3D *)0x0;
      }
      if (!bVar2) break;
      bVar2 = ProcessArray<aiVector3t<float>>
                        (pMesh->mTextureCoords + m_1,pMesh->mNumVertices,"uvcoords",
                         (vector<bool,_std::allocator<bool>_> *)local_50,false,true);
      if (bVar2) {
        pMesh->mNumUVComponents[m_1] = 0;
        f_1._4_4_ = m_1;
        while (f_1._4_4_ = f_1._4_4_ + 1, f_1._4_4_ < 8) {
          if (pMesh->mTextureCoords[f_1._4_4_] != (aiVector3D *)0x0) {
            operator_delete__(pMesh->mTextureCoords[f_1._4_4_]);
          }
          pMesh->mTextureCoords[f_1._4_4_] = (aiVector3D *)0x0;
          pMesh->mNumUVComponents[f_1._4_4_] = 0;
        }
        dirtyMask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._7_1_ = 1;
      }
      m_1 = m_1 + 1;
    }
  }
  if ((pMesh->mNormals != (aiVector3D *)0x0) || (pMesh->mTangents != (aiVector3D *)0x0)) {
    if (((pMesh->mPrimitiveTypes & 1) != 0) || ((pMesh->mPrimitiveTypes & 2) != 0)) {
      if (((pMesh->mPrimitiveTypes & 4) == 0) && ((pMesh->mPrimitiveTypes & 8) == 0)) {
        this_local._4_4_ =
             (uint)(dirtyMask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage._7_1_ & 1);
        goto LAB_0054c457;
      }
      for (f_1._0_4_ = 0; (uint)f_1 < pMesh->mNumFaces; f_1._0_4_ = (uint)f_1 + 1) {
        local_a0 = pMesh->mFaces + (uint)f_1;
        if (local_a0->mNumIndices < 3) {
          rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_50,
                             (ulong)*local_a0->mIndices);
          local_b0 = rVar3;
          std::_Bit_reference::operator=(&local_b0,true);
          if (local_a0->mNumIndices == 2) {
            rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)local_50,
                               (ulong)local_a0->mIndices[1]);
            local_c0 = rVar3;
            std::_Bit_reference::operator=(&local_c0,true);
          }
        }
      }
    }
    if (pMesh->mNormals != (aiVector3D *)0x0) {
      bVar2 = ProcessArray<aiVector3t<float>>
                        (&pMesh->mNormals,pMesh->mNumVertices,"normals",
                         (vector<bool,_std::allocator<bool>_> *)local_50,true,false);
      if (bVar2) {
        dirtyMask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._7_1_ = 1;
      }
    }
    if (pMesh->mTangents != (aiVector3D *)0x0) {
      bVar2 = ProcessArray<aiVector3t<float>>
                        (&pMesh->mTangents,pMesh->mNumVertices,"tangents",
                         (vector<bool,_std::allocator<bool>_> *)local_50,false,true);
      if (bVar2) {
        if (pMesh->mBitangents != (aiVector3D *)0x0) {
          operator_delete__(pMesh->mBitangents);
        }
        pMesh->mBitangents = (aiVector3D *)0x0;
        dirtyMask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._7_1_ = 1;
      }
    }
    if (pMesh->mBitangents != (aiVector3D *)0x0) {
      bVar2 = ProcessArray<aiVector3t<float>>
                        (&pMesh->mBitangents,pMesh->mNumVertices,"bitangents",
                         (vector<bool,_std::allocator<bool>_> *)local_50,false,true);
      if (bVar2) {
        if (pMesh->mTangents != (aiVector3D *)0x0) {
          operator_delete__(pMesh->mTangents);
        }
        pMesh->mTangents = (aiVector3D *)0x0;
        dirtyMask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._7_1_ = 1;
      }
    }
  }
  this_local._4_4_ =
       (uint)((dirtyMask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_end_of_storage._7_1_ & 1) != 0);
LAB_0054c457:
  a = 1;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_50)
  ;
  return this_local._4_4_;
}

Assistant:

int FindInvalidDataProcess::ProcessMesh(aiMesh* pMesh)
{
    bool ret = false;
    std::vector<bool> dirtyMask(pMesh->mNumVertices, pMesh->mNumFaces != 0);

    // Ignore elements that are not referenced by vertices.
    // (they are, for example, caused by the FindDegenerates step)
    for (unsigned int m = 0; m < pMesh->mNumFaces; ++m) {
        const aiFace& f = pMesh->mFaces[m];

        for (unsigned int i = 0; i < f.mNumIndices; ++i) {
            dirtyMask[f.mIndices[i]] = false;
        }
    }

    // Process vertex positions
    if (pMesh->mVertices && ProcessArray(pMesh->mVertices, pMesh->mNumVertices, "positions", dirtyMask)) {
        ASSIMP_LOG_ERROR("Deleting mesh: Unable to continue without vertex positions");

        return 2;
    }

    // process texture coordinates
    if (!mIgnoreTexCoods) {
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS && pMesh->mTextureCoords[i]; ++i) {
            if (ProcessArray(pMesh->mTextureCoords[i], pMesh->mNumVertices, "uvcoords", dirtyMask)) {
                pMesh->mNumUVComponents[i] = 0;

                // delete all subsequent texture coordinate sets.
                for (unsigned int a = i + 1; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
                    delete[] pMesh->mTextureCoords[a];
                    pMesh->mTextureCoords[a] = NULL;
                    pMesh->mNumUVComponents[a] = 0;
                }

                ret = true;
            }
        }
    }

    // -- we don't validate vertex colors, it's difficult to say whether
    // they are invalid or not.

    // Normals and tangents are undefined for point and line faces.
    if (pMesh->mNormals || pMesh->mTangents)    {

        if (aiPrimitiveType_POINT & pMesh->mPrimitiveTypes ||
            aiPrimitiveType_LINE  & pMesh->mPrimitiveTypes)
        {
            if (aiPrimitiveType_TRIANGLE & pMesh->mPrimitiveTypes ||
                aiPrimitiveType_POLYGON  & pMesh->mPrimitiveTypes)
            {
                // We need to update the lookup-table
                for (unsigned int m = 0; m < pMesh->mNumFaces;++m) {
                    const aiFace& f = pMesh->mFaces[ m ];

                    if (f.mNumIndices < 3)  {
                        dirtyMask[f.mIndices[0]] = true;
                        if (f.mNumIndices == 2) {
                            dirtyMask[f.mIndices[1]] = true;
                        }
                    }
                }
            }
            // Normals, tangents and bitangents are undefined for
            // the whole mesh (and should not even be there)
            else {
                return ret;
            }
        }

        // Process mesh normals
        if (pMesh->mNormals && ProcessArray(pMesh->mNormals,pMesh->mNumVertices,
            "normals",dirtyMask,true,false))
            ret = true;

        // Process mesh tangents
        if (pMesh->mTangents && ProcessArray(pMesh->mTangents,pMesh->mNumVertices,"tangents",dirtyMask))    {
            delete[] pMesh->mBitangents; pMesh->mBitangents = NULL;
            ret = true;
        }

        // Process mesh bitangents
        if (pMesh->mBitangents && ProcessArray(pMesh->mBitangents,pMesh->mNumVertices,"bitangents",dirtyMask))  {
            delete[] pMesh->mTangents; pMesh->mTangents = NULL;
            ret = true;
        }
    }
    return ret ? 1 : 0;
}